

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorNull.cpp
# Opt level: O2

int __thiscall
pele::physics::reactions::ReactorNull::react
          (ReactorNull *this,Box *box,Array4<double> *rY_in,Array4<double> *rYsrc_in,
          Array4<double> *T_in,Array4<double> *rEner_in,Array4<double> *rEner_src_in,
          Array4<double> *FC_in,Array4<int> *param_8,Real *dt_react,Real *param_10)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  int n_1;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  Real tT_1;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  Real tT;
  Real hml [21];
  Real tmp [21];
  Real rY_loc [21];
  undefined1 local_648 [16];
  double local_5a8 [22];
  double *local_4f8;
  double *local_4f0;
  double *local_4e8;
  double *local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  int local_4ac;
  double local_4a8 [22];
  undefined1 local_3f8 [16];
  long local_3e0;
  long local_3d8;
  Real local_3d0;
  double local_3c8;
  undefined8 uStack_3c0;
  double local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  double *local_370;
  long local_368;
  long local_360;
  double *local_358;
  long local_350;
  long local_348;
  double *local_340;
  long local_338;
  long local_330;
  double *local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  Long local_300;
  long local_2f8;
  Long local_2f0;
  long local_2e8;
  Long local_2e0;
  long local_2d8;
  Long local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  double *local_278;
  double *local_270;
  double local_268;
  undefined8 uStack_260;
  double local_258;
  undefined8 uStack_250;
  double local_248 [22];
  double local_198;
  undefined8 uStack_190;
  double adStack_188 [22];
  double adStack_d8 [21];
  
  local_4ac = this->m_reactor_type;
  local_3d0 = *dt_react;
  local_320 = (long)(box->smallend).vect[1];
  local_310 = (long)(box->smallend).vect[2];
  local_328 = rEner_in->p;
  local_2d0 = rEner_in->jstride;
  local_330 = rEner_in->kstride;
  local_280 = (long)(rEner_in->begin).x;
  local_2d8 = (long)(rEner_in->begin).y;
  local_338 = (long)(rEner_in->begin).z;
  local_4f8 = rY_in->p +
              (((local_320 - (rY_in->begin).y) * rY_in->jstride +
               (local_310 - (rY_in->begin).z) * rY_in->kstride) - (long)(rY_in->begin).x);
  local_340 = rEner_src_in->p;
  local_2e0 = rEner_src_in->jstride;
  local_348 = rEner_src_in->kstride;
  local_288 = (long)(rEner_src_in->begin).x;
  local_2e8 = (long)(rEner_src_in->begin).y;
  local_350 = (long)(rEner_src_in->begin).z;
  lVar3 = rY_in->nstride;
  local_4f0 = rYsrc_in->p +
              (((local_320 - (rYsrc_in->begin).y) * rYsrc_in->jstride +
               (local_310 - (rYsrc_in->begin).z) * rYsrc_in->kstride) - (long)(rYsrc_in->begin).x);
  lVar4 = rYsrc_in->nstride;
  local_358 = T_in->p;
  local_2f0 = T_in->jstride;
  local_360 = T_in->kstride;
  local_290 = (long)(T_in->begin).x;
  local_2f8 = (long)(T_in->begin).y;
  local_368 = (long)(T_in->begin).z;
  local_370 = FC_in->p;
  local_300 = FC_in->jstride;
  local_378 = FC_in->kstride;
  local_298 = (long)(FC_in->begin).x;
  local_308 = (long)(FC_in->begin).y;
  local_380 = (long)(FC_in->begin).z;
  iVar1 = (box->smallend).vect[0];
  iVar2 = (box->bigend).vect[0];
  local_2a0 = (long)(box->bigend).vect[1];
  local_318 = (long)(box->bigend).vect[2];
  local_388 = rYsrc_in->kstride << 3;
  local_2a8 = rYsrc_in->jstride << 3;
  local_390 = rY_in->kstride << 3;
  local_3e0 = rY_in->jstride << 3;
  do {
    if (local_318 < local_310) {
      return 0;
    }
    local_2b0 = local_328 + (local_310 - local_338) * local_330;
    local_2b8 = local_340 + (local_310 - local_350) * local_348;
    local_2c0 = local_358 + (local_310 - local_368) * local_360;
    local_2c8 = local_370 + (local_310 - local_380) * local_378;
    local_4e0 = local_4f8;
    local_4e8 = local_4f0;
    for (local_3d8 = local_320; pdVar6 = local_2b0, pdVar5 = local_2c0, local_3d8 <= local_2a0;
        local_3d8 = local_3d8 + 1) {
      if (iVar1 <= iVar2) {
        lVar9 = (local_3d8 - local_2d8) * local_2d0;
        local_270 = local_2b8 + (local_3d8 - local_2e8) * local_2e0;
        lVar10 = (local_3d8 - local_2f8) * local_2f0;
        local_278 = local_2c8 + (local_3d8 - local_308) * local_300;
        iVar7 = iVar1;
        do {
          lVar15 = (long)iVar7;
          pdVar11 = local_4e8 + lVar15;
          pdVar13 = local_4e0 + lVar15;
          dVar23 = local_270[lVar15 - local_288] * local_3d0 + pdVar6[lVar9 + (lVar15 - local_280)];
          pdVar6[lVar9 + (lVar15 - local_280)] = dVar23;
          for (lVar14 = 0; lVar14 != 0x15; lVar14 = lVar14 + 1) {
            dVar32 = *pdVar11 * local_3d0 + *pdVar13;
            adStack_d8[lVar14] = dVar32;
            *pdVar13 = dVar32;
            pdVar11 = pdVar11 + lVar4;
            pdVar13 = pdVar13 + lVar3;
          }
          dVar32 = 0.0;
          for (lVar14 = 0; lVar14 != 0xa8; lVar14 = lVar14 + 8) {
            dVar32 = dVar32 + *(double *)((long)adStack_d8 + lVar14);
          }
          for (lVar14 = 0; lVar14 != 0x15; lVar14 = lVar14 + 1) {
            local_248[lVar14] = adStack_d8[lVar14] / dVar32;
          }
          dVar23 = dVar23 / dVar32;
          lVar14 = lVar15 - local_290;
          local_648._0_8_ = pdVar5[lVar10 + lVar14];
          if (local_4ac == 2) {
            local_4a8[0] = 0.49603174603174605;
            local_4a8[1] = 0.9920634920634921;
            local_4a8[2] = 0.06250390649415588;
            local_4a8[3] = 0.03125195324707794;
            local_4a8[4] = 0.05879931792791203;
            local_4a8[5] = 0.055509297807382736;
            local_4a8[6] = 0.030297521662727988;
            local_4a8[7] = 0.07129108148570615;
            local_4a8[8] = 0.07129108148570615;
            local_4a8[9] = 0.06651147322913202;
            local_4a8[10] = 0.06233248145608677;
            local_4a8[0xb] = 0.035701535166012134;
            local_4a8[0xc] = 0.022722624917630486;
            local_4a8[0xd] = 0.03446136880556896;
            local_4a8[0xe] = 0.033304469459801506;
            local_4a8[0xf] = 0.032222723464587225;
            local_4a8[0x10] = 0.035645540742853074;
            local_4a8[0x11] = 0.034409194136673316;
            local_4a8[0x12] = 0.03325573661456601;
            local_4a8[0x13] = 0.03569643749553795;
            local_4a8[0x14] = 0.025031289111389236;
            local_5a8[0] = -7.5448392924019965;
            local_5a8[1] = 285.54066555558234;
            local_5a8[2] = 326.6182026848913;
            local_5a8[3] = -8.14912592473577;
            local_5a8[4] = 44.06329691642184;
            local_5a8[5] = -332.47333415288796;
            local_5a8[6] = 7.416557417884642;
            local_5a8[7] = 514.9691455669571;
            local_5a8[8] = 565.188878716436;
            local_5a8[9] = 186.5005448171647;
            local_5a8[10] = -109.19278746014625;
            local_5a8[0xb] = -155.82376694627825;
            local_5a8[0xc] = -534.7240369423979;
            local_5a8[0xd] = 46.77187830798779;
            local_5a8[0xe] = -154.54652980329192;
            local_5a8[0xf] = 13.317392866975975;
            local_5a8[0x10] = 60.31351117312794;
            local_5a8[0x11] = 146.92642001693605;
            local_5a8[0x12] = -123.83136094758275;
            local_5a8[0x13] = -7.99098901888766;
            local_5a8[0x14] = -5.781944444444445;
            for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
              adStack_188[lVar12] = local_248[lVar12] * local_5a8[lVar12] * local_4a8[lVar12];
            }
            dVar32 = 0.0;
            for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
              dVar32 = dVar32 + adStack_188[lVar12];
            }
            local_4a8[0] = 0.49603174603174605;
            local_4a8[1] = 0.9920634920634921;
            local_4a8[2] = 0.06250390649415588;
            local_4a8[3] = 0.03125195324707794;
            local_4a8[4] = 0.05879931792791203;
            local_4a8[5] = 0.055509297807382736;
            local_4a8[6] = 0.030297521662727988;
            local_4a8[7] = 0.07129108148570615;
            local_4a8[8] = 0.07129108148570615;
            local_4a8[9] = 0.06651147322913202;
            local_4a8[10] = 0.06233248145608677;
            local_4a8[0xb] = 0.035701535166012134;
            local_4a8[0xc] = 0.022722624917630486;
            local_4a8[0xd] = 0.03446136880556896;
            local_4a8[0xe] = 0.033304469459801506;
            local_4a8[0xf] = 0.032222723464587225;
            local_4a8[0x10] = 0.035645540742853074;
            local_4a8[0x11] = 0.034409194136673316;
            local_4a8[0x12] = 0.03325573661456601;
            local_4a8[0x13] = 0.03569643749553795;
            local_4a8[0x14] = 0.025031289111389236;
            local_5a8[0] = 3.816949232619999;
            local_5a8[1] = 8.868414974743045;
            local_5a8[2] = 9.828198812712;
            local_5a8[3] = 4.17604336552;
            local_5a8[4] = 5.0231187763200005;
            local_5a8[5] = -1.6797818435599994;
            local_5a8[6] = 6.420755411050001;
            local_5a8[7] = 17.44011709576;
            local_5a8[8] = 18.5522221082;
            local_5a8[9] = 12.167106433720003;
            local_5a8[10] = 8.268281403500001;
            local_5a8[0xb] = 0.6133734280800004;
            local_5a8[0xc] = -5.35716015368;
            local_5a8[0xd] = 7.1336556343;
            local_5a8[0xe] = 4.651850048199999;
            local_5a8[0xf] = 10.607800009999998;
            local_5a8[0x10] = 13.890608203799996;
            local_5a8[0x11] = 17.765740160799997;
            local_5a8[0x12] = 13.813688624;
            local_5a8[0x13] = 3.9097766838000005;
            local_5a8[0x14] = 2.31365625;
            for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
              adStack_188[lVar12] = local_248[lVar12] * local_5a8[lVar12] * local_4a8[lVar12];
            }
            dVar19 = 0.0;
            for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
              dVar19 = dVar19 + adStack_188[lVar12];
            }
            dVar32 = dVar32 * 7483016356.337915;
            dVar19 = dVar19 * 332578504726.1296;
            if (dVar32 <= dVar23) {
              if (dVar23 <= dVar19) {
                if (((double)local_648._0_8_ < 90.0) || (4000.0 < (double)local_648._0_8_)) {
                  local_648._0_8_ = (dVar23 - dVar32) * (3910.0 / (dVar19 - dVar32)) + 90.0;
                }
                for (iVar8 = 0; iVar8 != 200; iVar8 = iVar8 + 1) {
                  dVar20 = (double)local_648._0_8_ * (double)local_648._0_8_;
                  dVar19 = (double)local_648._0_8_ * dVar20;
                  dVar32 = (double)local_648._0_8_ * dVar19;
                  local_4a8[0] = 0.49603174603174605;
                  local_4a8[1] = 0.9920634920634921;
                  local_4a8[2] = 0.06250390649415588;
                  local_4a8[3] = 0.03125195324707794;
                  local_4a8[4] = 0.05879931792791203;
                  local_4a8[5] = 0.055509297807382736;
                  local_4a8[6] = 0.030297521662727988;
                  local_4a8[7] = 0.07129108148570615;
                  local_4a8[8] = 0.07129108148570615;
                  local_4a8[9] = 0.06651147322913202;
                  local_4a8[10] = 0.06233248145608677;
                  local_4a8[0xb] = 0.035701535166012134;
                  local_4a8[0xc] = 0.022722624917630486;
                  local_4a8[0xd] = 0.03446136880556896;
                  local_4a8[0xe] = 0.033304469459801506;
                  local_4a8[0xf] = 0.032222723464587225;
                  local_4a8[0x10] = 0.035645540742853074;
                  local_4a8[0x11] = 0.034409194136673316;
                  local_4a8[0x12] = 0.03325573661456601;
                  local_4a8[0x13] = 0.03569643749553795;
                  local_4a8[0x14] = 0.025031289111389236;
                  dVar22 = 1.0 / (double)local_648._0_8_;
                  if (1000.0 <= (double)local_648._0_8_) {
                    local_5a8[0] = dVar22 * -950.158922 +
                                   dVar32 * 4.00510752e-15 +
                                   dVar19 * -4.48915985e-11 +
                                   dVar20 * 1.66485593e-07 +
                                   (double)local_648._0_8_ * -2.47012365e-05 + 3.3372792;
                    local_5a8[1] = dVar22 * 25473.6599 +
                                   dVar32 * 9.96394714e-23 +
                                   dVar19 * -1.18378809e-18 +
                                   dVar20 * 5.38539827e-15 +
                                   (double)local_648._0_8_ * -1.15421486e-11 + 2.50000001;
                    local_5a8[2] = dVar22 * 29217.5791 +
                                   dVar32 * 2.45667382e-16 +
                                   dVar19 * -2.50444497e-12 +
                                   dVar20 * 1.39828196e-08 +
                                   (double)local_648._0_8_ * -4.29870569e-05 + 2.56942078;
                    local_5a8[3] = dVar22 * -1088.45772 +
                                   dVar32 * -4.33435588e-15 +
                                   dVar19 * 5.23676387e-11 +
                                   dVar20 * -2.52655556e-07 +
                                   (double)local_648._0_8_ * 0.00074154377 + 3.28253784;
                    local_5a8[4] = dVar22 * 3858.657 +
                                   dVar32 * 2.34824752e-15 +
                                   dVar19 * -2.19865389e-11 +
                                   dVar20 * 4.21684093e-08 +
                                   (double)local_648._0_8_ * 0.000274214858 + 3.09288767;
                    local_5a8[5] = dVar22 * -30004.2971 +
                                   dVar32 * 3.36401984e-15 +
                                   dVar19 * -2.42604967e-11 +
                                   dVar20 * -5.46908393e-08 +
                                   (double)local_648._0_8_ * 0.00108845902 + 3.03399249;
                    local_5a8[6] = dVar22 * 111.856713 +
                                   dVar32 * -2.1581707e-15 +
                                   dVar19 * 2.85615925e-11 +
                                   dVar20 * -2.11219383e-07 +
                                   (double)local_648._0_8_ * 0.00111991006 + 4.0172109;
                    local_5a8[7] = dVar22 * 46263.604 +
                                   dVar32 * -3.75455134e-15 +
                                   dVar19 * 6.50448872e-11 +
                                   dVar20 * -4.69648657e-07 +
                                   (double)local_648._0_8_ * 0.00182819646 + 2.87410113;
                    local_5a8[8] = dVar22 * 50925.9997 +
                                   dVar32 * -6.7943273e-15 +
                                   dVar19 * 1.044765e-10 +
                                   dVar20 * -6.70639823e-07 +
                                   (double)local_648._0_8_ * 0.00232794318 + 2.29203842;
                    local_5a8[9] = dVar22 * 16775.5843 +
                                   dVar32 * -9.34308788e-15 +
                                   dVar19 * 1.48921161e-10 +
                                   dVar20 * -9.95714493e-07 +
                                   (double)local_648._0_8_ * 0.00361995018 + 2.28571772;
                    local_5a8[10] =
                         dVar22 * -9468.34459 +
                         dVar32 * -2.0363046e-14 +
                         dVar19 * 3.05731338e-10 +
                         dVar20 * -1.9109527e-06 +
                         (double)local_648._0_8_ * 0.00669547335 + 0.074851495;
                    local_5a8[0xb] =
                         dVar22 * -14151.8724 +
                         dVar32 * -4.07295432e-15 +
                         dVar19 * 5.7513252e-11 +
                         dVar20 * -3.32941924e-07 +
                         (double)local_648._0_8_ * 0.00103126372 + 2.71518561;
                    local_5a8[0xc] =
                         dVar22 * -48759.166 +
                         dVar32 * -9.44168328e-15 +
                         dVar19 * 1.30872547e-10 +
                         dVar20 * -7.38271347e-07 +
                         (double)local_648._0_8_ * 0.00220718513 + 3.85746029;
                    local_5a8[0xd] =
                         dVar22 * 4011.91815 +
                         dVar32 * -1.06701742e-14 +
                         dVar19 * 1.47290445e-10 +
                         dVar20 * -8.28152043e-07 +
                         (double)local_648._0_8_ * 0.00247847763 + 2.77217438;
                    local_5a8[0xe] =
                         dVar22 * -13995.8323 +
                         dVar32 * -1.76771128e-14 +
                         dVar19 * 2.5160303e-10 +
                         dVar20 * -1.47419604e-06 +
                         (double)local_648._0_8_ * 0.00460000041 + 1.76069008;
                    local_5a8[0xf] =
                         dVar22 * 127.83252 +
                         dVar32 * -4.225232e-15 +
                         dVar19 * 9.8610775e-11 +
                         dVar20 * -8.85461333e-07 +
                         (double)local_648._0_8_ * 0.0039357485 + 3.770799;
                    local_5a8[0x10] =
                         dVar22 * 4939.88614 +
                         dVar32 * -2.51412122e-14 +
                         dVar19 * 3.68057308e-10 +
                         dVar20 * -2.23692638e-06 +
                         (double)local_648._0_8_ * 0.00732270755 + 2.03611116;
                    local_5a8[0x11] =
                         dVar22 * 12857.52 +
                         dVar32 * -2.99283152e-14 +
                         dVar19 * 4.38044223e-10 +
                         dVar20 * -2.66068889e-06 +
                         (double)local_648._0_8_ * 0.0086986361 + 1.95465642;
                    local_5a8[0x12] =
                         dVar22 * -11426.3932 +
                         dVar32 * -3.8000578e-14 +
                         dVar19 * 5.53530003e-10 +
                         dVar20 * -3.3418689e-06 +
                         (double)local_648._0_8_ * 0.0108426339 + 1.0718815;
                    dVar24 = dVar32 * -1.3506702e-15 +
                             dVar19 * 2.5242595e-11 +
                             dVar20 * -1.89492e-07 +
                             (double)local_648._0_8_ * 0.0007439884 + 2.92664;
                    dVar21 = dVar22 * -922.7977;
                  }
                  else {
                    local_5a8[0] = dVar22 * -917.935173 +
                                   dVar32 * -1.47522352e-12 +
                                   dVar19 * 5.03930235e-09 +
                                   dVar20 * -6.492717e-06 +
                                   (double)local_648._0_8_ * 0.00399026037 + 2.34433112;
                    local_5a8[1] = dVar22 * 25473.6599 +
                                   dVar32 * -1.85546466e-22 +
                                   dVar19 * 5.7520408e-19 +
                                   dVar20 * -6.65306547e-16 +
                                   (double)local_648._0_8_ * 3.52666409e-13 + 2.5;
                    local_5a8[2] = dVar22 * 29122.2592 +
                                   dVar32 * 4.22531942e-13 +
                                   dVar19 * -1.53201656e-09 +
                                   dVar20 * 2.21435465e-06 +
                                   (double)local_648._0_8_ * -0.00163965942 + 3.1682671;
                    local_5a8[3] = dVar22 * -1063.94356 +
                                   dVar32 * 6.48745674e-13 +
                                   dVar19 * -2.42032377e-09 +
                                   dVar20 * 3.282434e-06 +
                                   (double)local_648._0_8_ * -0.00149836708 + 3.78245636;
                    local_5a8[4] = dVar22 * 3615.08056 +
                                   dVar32 * 2.7282294e-13 +
                                   dVar19 * -9.70283332e-10 +
                                   dVar20 * 1.5393128e-06 +
                                   (double)local_648._0_8_ * -0.00120065876 + 3.99201543;
                    local_5a8[5] = dVar22 * -30293.7267 +
                                   dVar32 * 3.54395634e-13 +
                                   dVar19 * -1.37199266e-09 +
                                   dVar20 * 2.17346737e-06 +
                                   (double)local_648._0_8_ * -0.00101821705 + 4.19864056;
                    local_5a8[6] = dVar22 * 294.80804 +
                                   dVar32 * 1.85845025e-12 +
                                   dVar19 * -6.06909735e-09 +
                                   dVar20 * 7.05276303e-06 +
                                   (double)local_648._0_8_ * -0.00237456025 + 4.30179801;
                    local_5a8[7] = dVar22 * 46004.0401 +
                                   dVar32 * 3.37483438e-13 +
                                   dVar19 * -9.62727883e-10 +
                                   dVar20 * 9.31632803e-07 +
                                   (double)local_648._0_8_ * 0.000484436072 + 3.76267867;
                    local_5a8[8] = dVar22 * 50496.8163 +
                                   dVar32 * 3.88629474e-13 +
                                   dVar19 * -1.67203995e-09 +
                                   dVar20 * 2.74432073e-06 +
                                   (double)local_648._0_8_ * -0.0011833071 + 4.19860411;
                    local_5a8[9] = dVar22 * 16444.9988 +
                                   dVar32 * 5.08771468e-13 +
                                   dVar19 * -1.71779356e-09 +
                                   dVar20 * 1.91007285e-06 +
                                   (double)local_648._0_8_ * 0.00100547588 + 3.6735904;
                    local_5a8[10] =
                         dVar22 * -10246.6476 +
                         dVar32 * 3.33387912e-12 +
                         dVar19 * -1.21185757e-08 +
                         dVar20 * 1.63933533e-05 +
                         (double)local_648._0_8_ * -0.0068354894 + 5.14987613;
                    local_5a8[0xb] =
                         dVar22 * -14344.086 +
                         dVar32 * -1.808849e-13 +
                         dVar19 * 2.26751471e-10 +
                         dVar20 * 3.3893811e-07 +
                         (double)local_648._0_8_ * -0.00030517684 + 3.57953347;
                    local_5a8[0xc] =
                         dVar22 * -48371.9697 +
                         dVar32 * -2.87399096e-14 +
                         dVar19 * 6.14797555e-10 +
                         dVar20 * -2.3745209e-06 +
                         (double)local_648._0_8_ * 0.00449229839 + 2.35677352;
                    local_5a8[0xd] =
                         dVar22 * 3839.56496 +
                         dVar32 * 8.6753773e-13 +
                         dVar19 * -3.32860233e-09 +
                         dVar20 * 4.59331487e-06 +
                         (double)local_648._0_8_ * -0.00162196266 + 4.22118584;
                    local_5a8[0xe] =
                         dVar22 * -14308.9567 +
                         dVar32 * 2.63545304e-12 +
                         dVar19 * -9.48213152e-09 +
                         dVar20 * 1.24406669e-05 +
                         (double)local_648._0_8_ * -0.00495416684 + 4.79372315;
                    local_5a8[0xf] =
                         dVar22 * 978.6011 +
                         dVar32 * 4.15122e-13 +
                         dVar19 * -1.844409e-09 +
                         dVar20 * 1.77949067e-06 + (double)local_648._0_8_ * 0.0036082975 + 2.106204
                    ;
                    local_5a8[0x10] =
                         dVar22 * 5089.77593 +
                         dVar32 * 5.39768746e-12 +
                         dVar19 * -1.72897188e-08 +
                         dVar20 * 1.90330097e-05 +
                         (double)local_648._0_8_ * -0.00378526124 + 3.95920148;
                    local_5a8[0x11] =
                         dVar22 * 12841.6265 +
                         dVar32 * 4.61018008e-12 +
                         dVar19 * -1.49781651e-08 +
                         dVar20 * 1.65714269e-05 +
                         (double)local_648._0_8_ * -0.00209329446 + 4.30646568;
                    local_5a8[0x12] =
                         dVar22 * -11522.2055 +
                         dVar32 * 5.37371542e-12 +
                         dVar19 * -1.77116571e-08 +
                         dVar20 * 1.99812763e-05 +
                         (double)local_648._0_8_ * -0.00275077135 + 4.29142492;
                    dVar24 = dVar32 * -4.889708e-13 +
                             dVar19 * 1.41037875e-09 +
                             dVar20 * -1.321074e-06 +
                             (double)local_648._0_8_ * 0.0007041202 + 3.298677;
                    dVar21 = dVar22 * -1020.8999;
                  }
                  local_5a8[0x13] = dVar21 + dVar24;
                  dVar21 = dVar32 * 0.0 +
                           dVar19 * 0.0 + dVar20 * 0.0 + (double)local_648._0_8_ * 0.0 + 2.5;
                  local_5a8[0x14] = dVar22 * -745.375 + dVar21;
                  for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                    adStack_188[lVar12] = local_248[lVar12] * local_5a8[lVar12] * local_4a8[lVar12];
                  }
                  dVar22 = 0.0;
                  for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                    dVar22 = dVar22 + adStack_188[lVar12];
                  }
                  local_4a8[0] = 0.49603174603174605;
                  local_4a8[1] = 0.9920634920634921;
                  local_4a8[2] = 0.06250390649415588;
                  local_4a8[3] = 0.03125195324707794;
                  local_4a8[4] = 0.05879931792791203;
                  local_4a8[5] = 0.055509297807382736;
                  local_4a8[6] = 0.030297521662727988;
                  local_4a8[7] = 0.07129108148570615;
                  local_4a8[8] = 0.07129108148570615;
                  local_4a8[9] = 0.06651147322913202;
                  local_4a8[10] = 0.06233248145608677;
                  local_4a8[0xb] = 0.035701535166012134;
                  local_4a8[0xc] = 0.022722624917630486;
                  local_4a8[0xd] = 0.03446136880556896;
                  local_4a8[0xe] = 0.033304469459801506;
                  local_4a8[0xf] = 0.032222723464587225;
                  local_4a8[0x10] = 0.035645540742853074;
                  local_4a8[0x11] = 0.034409194136673316;
                  local_4a8[0x12] = 0.03325573661456601;
                  local_4a8[0x13] = 0.03569643749553795;
                  local_4a8[0x14] = 0.025031289111389236;
                  if (1000.0 <= (double)local_648._0_8_) {
                    local_5a8[0] = dVar32 * 2.00255376e-14 +
                                   dVar19 * -1.79566394e-10 +
                                   dVar20 * 4.99456778e-07 +
                                   (double)local_648._0_8_ * -4.94024731e-05 + 3.3372792;
                    local_5a8[1] = dVar32 * 4.98197357e-22 +
                                   dVar19 * -4.73515235e-18 +
                                   dVar20 * 1.61561948e-14 +
                                   (double)local_648._0_8_ * -2.30842973e-11 + 2.50000001;
                    local_5a8[2] = dVar32 * 1.22833691e-15 +
                                   dVar19 * -1.00177799e-11 +
                                   dVar20 * 4.19484589e-08 +
                                   (double)local_648._0_8_ * -8.59741137e-05 + 2.56942078;
                    local_5a8[3] = dVar32 * -2.16717794e-14 +
                                   dVar19 * 2.09470555e-10 +
                                   dVar20 * -7.57966669e-07 +
                                   (double)local_648._0_8_ * 0.00148308754 + 3.28253784;
                    local_5a8[4] = dVar32 * 1.17412376e-14 +
                                   dVar19 * -8.79461556e-11 +
                                   dVar20 * 1.26505228e-07 +
                                   (double)local_648._0_8_ * 0.000548429716 + 3.09288767;
                    local_5a8[5] = dVar32 * 1.68200992e-14 +
                                   dVar19 * -9.7041987e-11 +
                                   dVar20 * -1.64072518e-07 +
                                   (double)local_648._0_8_ * 0.00217691804 + 3.03399249;
                    local_5a8[6] = dVar32 * -1.07908535e-14 +
                                   dVar19 * 1.1424637e-10 +
                                   dVar20 * -6.3365815e-07 +
                                   (double)local_648._0_8_ * 0.00223982013 + 4.0172109;
                    local_5a8[7] = dVar32 * -1.87727567e-14 +
                                   dVar19 * 2.60179549e-10 +
                                   dVar20 * -1.40894597e-06 +
                                   (double)local_648._0_8_ * 0.00365639292 + 2.87410113;
                    local_5a8[8] = dVar32 * -3.39716365e-14 +
                                   dVar19 * 4.17906e-10 +
                                   dVar20 * -2.01191947e-06 +
                                   (double)local_648._0_8_ * 0.00465588637 + 2.29203842;
                    local_5a8[9] = dVar32 * -4.67154394e-14 +
                                   dVar19 * 5.95684644e-10 +
                                   dVar20 * -2.98714348e-06 +
                                   (double)local_648._0_8_ * 0.00723990037 + 2.28571772;
                    local_5a8[10] =
                         dVar32 * -1.0181523e-13 +
                         dVar19 * 1.22292535e-09 +
                         dVar20 * -5.73285809e-06 +
                         (double)local_648._0_8_ * 0.0133909467 + 0.074851495;
                    local_5a8[0xb] =
                         dVar32 * -2.03647716e-14 +
                         dVar19 * 2.30053008e-10 +
                         dVar20 * -9.98825771e-07 +
                         (double)local_648._0_8_ * 0.00206252743 + 2.71518561;
                    local_5a8[0xc] =
                         dVar32 * -4.72084164e-14 +
                         dVar19 * 5.23490188e-10 +
                         dVar20 * -2.21481404e-06 +
                         (double)local_648._0_8_ * 0.00441437026 + 3.85746029;
                    local_5a8[0xd] =
                         dVar32 * -5.33508711e-14 +
                         dVar19 * 5.89161778e-10 +
                         dVar20 * -2.48445613e-06 +
                         (double)local_648._0_8_ * 0.00495695526 + 2.77217438;
                    local_5a8[0xe] =
                         dVar32 * -8.8385564e-14 +
                         dVar19 * 1.00641212e-09 +
                         dVar20 * -4.42258813e-06 +
                         (double)local_648._0_8_ * 0.00920000082 + 1.76069008;
                    local_5a8[0xf] =
                         dVar32 * -2.112616e-14 +
                         dVar19 * 3.944431e-10 +
                         dVar20 * -2.656384e-06 + (double)local_648._0_8_ * 0.007871497 + 3.770799;
                    local_5a8[0x10] =
                         dVar32 * -1.25706061e-13 +
                         dVar19 * 1.47222923e-09 +
                         dVar20 * -6.71077915e-06 +
                         (double)local_648._0_8_ * 0.0146454151 + 2.03611116;
                    local_5a8[0x11] =
                         dVar32 * -1.49641576e-13 +
                         dVar19 * 1.75217689e-09 +
                         dVar20 * -7.98206668e-06 +
                         (double)local_648._0_8_ * 0.0173972722 + 1.95465642;
                    local_5a8[0x12] =
                         dVar32 * -1.9000289e-13 +
                         dVar19 * 2.21412001e-09 +
                         dVar20 * -1.00256067e-05 +
                         (double)local_648._0_8_ * 0.0216852677 + 1.0718815;
                    dVar19 = dVar19 * 1.0097038e-10 +
                             dVar20 * -5.68476e-07 +
                             (double)local_648._0_8_ * 0.0014879768 + 2.92664;
                    dVar32 = dVar32 * -6.753351e-15;
                  }
                  else {
                    local_5a8[0] = dVar32 * -7.37611761e-12 +
                                   dVar19 * 2.01572094e-08 +
                                   dVar20 * -1.9478151e-05 +
                                   (double)local_648._0_8_ * 0.00798052075 + 2.34433112;
                    local_5a8[1] = dVar32 * -9.27732332e-22 +
                                   dVar19 * 2.30081632e-18 +
                                   dVar20 * -1.99591964e-15 +
                                   (double)local_648._0_8_ * 7.05332819e-13 + 2.5;
                    local_5a8[2] = dVar32 * 2.11265971e-12 +
                                   dVar19 * -6.12806624e-09 +
                                   dVar20 * 6.64306396e-06 +
                                   (double)local_648._0_8_ * -0.00327931884 + 3.1682671;
                    local_5a8[3] = dVar32 * 3.24372837e-12 +
                                   dVar19 * -9.68129509e-09 +
                                   dVar20 * 9.84730201e-06 +
                                   (double)local_648._0_8_ * -0.00299673416 + 3.78245636;
                    local_5a8[4] = dVar32 * 1.3641147e-12 +
                                   dVar19 * -3.88113333e-09 +
                                   dVar20 * 4.61793841e-06 +
                                   (double)local_648._0_8_ * -0.00240131752 + 3.99201543;
                    local_5a8[5] = dVar32 * 1.77197817e-12 +
                                   dVar19 * -5.48797062e-09 +
                                   dVar20 * 6.52040211e-06 +
                                   (double)local_648._0_8_ * -0.0020364341 + 4.19864056;
                    local_5a8[6] = dVar32 * 9.29225124e-12 +
                                   dVar19 * -2.42763894e-08 +
                                   dVar20 * 2.11582891e-05 +
                                   (double)local_648._0_8_ * -0.00474912051 + 4.30179801;
                    local_5a8[7] = dVar32 * 1.68741719e-12 +
                                   dVar19 * -3.85091153e-09 +
                                   dVar20 * 2.79489841e-06 +
                                   (double)local_648._0_8_ * 0.000968872143 + 3.76267867;
                    local_5a8[8] = dVar32 * 1.94314737e-12 +
                                   dVar19 * -6.68815981e-09 +
                                   dVar20 * 8.2329622e-06 +
                                   (double)local_648._0_8_ * -0.00236661419 + 4.19860411;
                    local_5a8[9] = dVar32 * 2.54385734e-12 +
                                   dVar19 * -6.87117425e-09 +
                                   dVar20 * 5.73021856e-06 +
                                   (double)local_648._0_8_ * 0.00201095175 + 3.6735904;
                    local_5a8[10] =
                         dVar32 * 1.66693956e-11 +
                         dVar19 * -4.84743026e-08 +
                         dVar20 * 4.91800599e-05 +
                         (double)local_648._0_8_ * -0.0136709788 + 5.14987613;
                    local_5a8[0xb] =
                         dVar32 * -9.04424499e-13 +
                         dVar19 * 9.07005884e-10 +
                         dVar20 * 1.01681433e-06 +
                         (double)local_648._0_8_ * -0.00061035368 + 3.57953347;
                    local_5a8[0xc] =
                         dVar32 * -1.43699548e-13 +
                         dVar19 * 2.45919022e-09 +
                         dVar20 * -7.12356269e-06 +
                         (double)local_648._0_8_ * 0.00898459677 + 2.35677352;
                    local_5a8[0xd] =
                         dVar32 * 4.33768865e-12 +
                         dVar19 * -1.33144093e-08 +
                         dVar20 * 1.37799446e-05 +
                         (double)local_648._0_8_ * -0.00324392532 + 4.22118584;
                    local_5a8[0xe] =
                         dVar32 * 1.31772652e-11 +
                         dVar19 * -3.79285261e-08 +
                         dVar20 * 3.73220008e-05 +
                         (double)local_648._0_8_ * -0.00990833369 + 4.79372315;
                    local_5a8[0xf] =
                         dVar32 * 2.07561e-12 +
                         dVar19 * -7.377636e-09 +
                         dVar20 * 5.338472e-06 + (double)local_648._0_8_ * 0.007216595 + 2.106204;
                    local_5a8[0x10] =
                         dVar32 * 2.69884373e-11 +
                         dVar19 * -6.91588753e-08 +
                         dVar20 * 5.70990292e-05 +
                         (double)local_648._0_8_ * -0.00757052247 + 3.95920148;
                    local_5a8[0x11] =
                         dVar32 * 2.30509004e-11 +
                         dVar19 * -5.99126606e-08 +
                         dVar20 * 4.97142807e-05 +
                         (double)local_648._0_8_ * -0.00418658892 + 4.30646568;
                    local_5a8[0x12] =
                         dVar32 * 2.68685771e-11 +
                         dVar19 * -7.08466285e-08 +
                         dVar20 * 5.99438288e-05 +
                         (double)local_648._0_8_ * -0.0055015427 + 4.29142492;
                    dVar19 = dVar19 * 5.641515e-09 +
                             dVar20 * -3.963222e-06 +
                             (double)local_648._0_8_ * 0.0014082404 + 3.298677;
                    dVar32 = dVar32 * -2.444854e-12;
                  }
                  local_5a8[0x13] = dVar32 + dVar19;
                  local_5a8[0x14] = dVar21;
                  for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                    adStack_188[lVar12] = local_5a8[lVar12] * local_248[lVar12] * local_4a8[lVar12];
                  }
                  dVar32 = 0.0;
                  for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                    dVar32 = dVar32 + adStack_188[lVar12];
                  }
                  dVar32 = (dVar23 - (double)local_648._0_8_ * 83144626.1815324 * dVar22) /
                           (dVar32 * 83144626.1815324);
                  dVar19 = 100.0;
                  if ((dVar32 <= 100.0) && (dVar19 = -100.0, -100.0 <= dVar32)) {
                    if (ABS(dVar32) < 1e-06) break;
                    dVar19 = dVar32;
                    if (((double)local_648._0_8_ + dVar32 == (double)local_648._0_8_) &&
                       (!NAN((double)local_648._0_8_ + dVar32) && !NAN((double)local_648._0_8_)))
                    break;
                  }
                  local_648._0_8_ = (double)local_648._0_8_ + dVar19;
                }
                local_4a8[0x14] = 0.025031289111389236;
                local_4a8[0x13] = 0.03569643749553795;
                local_4a8[0x12] = 0.03325573661456601;
                local_4a8[0x11] = 0.034409194136673316;
                local_4a8[0x10] = 0.035645540742853074;
                local_4a8[0xf] = 0.032222723464587225;
                local_4a8[0xe] = 0.033304469459801506;
                local_4a8[0xd] = 0.03446136880556896;
                local_4a8[0xc] = 0.022722624917630486;
                local_4a8[0xb] = 0.035701535166012134;
                local_4a8[10] = 0.06233248145608677;
                local_4a8[9] = 0.06651147322913202;
                local_4a8[8] = 0.07129108148570615;
                local_4a8[7] = 0.07129108148570615;
                local_4a8[6] = 0.030297521662727988;
                local_4a8[5] = 0.055509297807382736;
                local_4a8[4] = 0.05879931792791203;
                local_4a8[3] = 0.03125195324707794;
                local_4a8[2] = 0.06250390649415588;
                local_4a8[1] = 0.9920634920634921;
                local_4a8[0] = 0.49603174603174605;
              }
              else {
                local_4a8[0] = 0.49603174603174605;
                local_4a8[1] = 0.9920634920634921;
                local_4a8[2] = 0.06250390649415588;
                local_4a8[3] = 0.03125195324707794;
                local_4a8[4] = 0.05879931792791203;
                local_4a8[5] = 0.055509297807382736;
                local_4a8[6] = 0.030297521662727988;
                local_4a8[7] = 0.07129108148570615;
                local_4a8[8] = 0.07129108148570615;
                local_4a8[9] = 0.06651147322913202;
                local_4a8[10] = 0.06233248145608677;
                local_4a8[0xb] = 0.035701535166012134;
                local_4a8[0xc] = 0.022722624917630486;
                local_4a8[0xd] = 0.03446136880556896;
                local_4a8[0xe] = 0.033304469459801506;
                local_4a8[0xf] = 0.032222723464587225;
                local_4a8[0x10] = 0.035645540742853074;
                local_4a8[0x11] = 0.034409194136673316;
                local_4a8[0x12] = 0.03325573661456601;
                local_4a8[0x13] = 0.03569643749553795;
                local_4a8[0x14] = 0.025031289111389236;
                local_5a8[0] = 4.765266165199998;
                local_5a8[1] = 2.500000000650701;
                local_5a8[2] = 2.5700160029600005;
                local_5a8[3] = 4.9455612896000005;
                local_5a8[4] = 4.6878930491999995;
                local_5a8[5] = 7.211762589200001;
                local_5a8[6] = 7.387270204000001;
                local_5a8[7] = 6.802202710799999;
                local_5a8[8] = 6.774117436000006;
                local_5a8[9] = 9.615688249600005;
                local_5a8[10] = 14.115432375;
                local_5a8[0xb] = 4.494093976399998;
                local_5a8[0xc] = 7.4959341236;
                local_5a8[0xd] = 6.897228130399999;
                local_5a8[0xe] = 9.582954576000004;
                local_5a8[0xf] = 12.590704440000001;
                local_5a8[0x10] = 15.287224264000004;
                local_5a8[0x11] = 17.66175584400002;
                local_5a8[0x12] = 20.46618590000001;
                local_5a8[0x13] = 4.516177664;
                local_5a8[0x14] = 2.5;
                for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                  adStack_188[lVar12] = local_5a8[lVar12] * local_248[lVar12] * local_4a8[lVar12];
                }
                dVar32 = 0.0;
                for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                  dVar32 = dVar32 + adStack_188[lVar12];
                }
                local_648._0_8_ = (dVar19 - dVar23) / (dVar32 * -83144626.1815324) + 4000.0;
              }
            }
            else {
              local_4a8[0] = 0.49603174603174605;
              local_4a8[1] = 0.9920634920634921;
              local_4a8[2] = 0.06250390649415588;
              local_4a8[3] = 0.03125195324707794;
              local_4a8[4] = 0.05879931792791203;
              local_4a8[5] = 0.055509297807382736;
              local_4a8[6] = 0.030297521662727988;
              local_4a8[7] = 0.07129108148570615;
              local_4a8[8] = 0.07129108148570615;
              local_4a8[9] = 0.06651147322913202;
              local_4a8[10] = 0.06233248145608677;
              local_4a8[0xb] = 0.035701535166012134;
              local_4a8[0xc] = 0.022722624917630486;
              local_4a8[0xd] = 0.03446136880556896;
              local_4a8[0xe] = 0.033304469459801506;
              local_4a8[0xf] = 0.032222723464587225;
              local_4a8[0x10] = 0.035645540742853074;
              local_4a8[0x11] = 0.034409194136673316;
              local_4a8[0x12] = 0.03325573661456601;
              local_4a8[0x13] = 0.03569643749553795;
              local_4a8[0x14] = 0.025031289111389236;
              local_5a8[0] = 2.9190156229762083;
              local_5a8[1] = 2.5000000000489293;
              local_5a8[2] = 2.9226084737906133;
              local_5a8[3] = 3.5856685887787454;
              local_5a8[4] = 3.810562307688897;
              local_5a8[5] = 4.0642922769967536;
              local_5a8[6] = 4.028671482541256;
              local_5a8[7] = 3.8698192369274658;
              local_5a8[8] = 4.0475476481174555;
              local_5a8[9] = 3.8961486442878273;
              local_5a8[10] = 4.283602435639916;
              local_5a8[0xb] = 3.533439702871057;
              local_5a8[0xc] = 3.1094696930540358;
              local_5a8[0xd] = 4.031428503832626;
              local_5a8[0xe] = 4.177495989222872;
              local_5a8[0xf] = 2.7936970573281;
              local_5a8[0x10] = 3.691710485497553;
              local_5a8[0x11] = 4.290194390867844;
              local_5a8[0x12] = 4.231946745447031;
              local_5a8[0x13] = 3.39726879536406;
              local_5a8[0x14] = 2.5;
              for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                adStack_188[lVar12] = local_5a8[lVar12] * local_248[lVar12] * local_4a8[lVar12];
              }
              dVar19 = 0.0;
              for (lVar12 = 0; lVar12 != 0x15; lVar12 = lVar12 + 1) {
                dVar19 = dVar19 + adStack_188[lVar12];
              }
              local_648._0_8_ = (dVar32 - dVar23) / (dVar19 * -83144626.1815324) + 90.0;
            }
          }
          else if (local_4ac == 1) {
            dVar19 = (local_248[0x14] * -6.781944444444445 * 0.025031289111389236 +
                     local_248[0x13] * -8.99098901888766 * 0.03569643749553795 +
                     local_248[0x12] * -124.83136094758275 * 0.03325573661456601 +
                     local_248[0x11] * 145.92642001693605 * 0.034409194136673316 +
                     local_248[0x10] * 59.31351117312794 * 0.035645540742853074 +
                     local_248[0xf] * 12.317392866975975 * 0.032222723464587225 +
                     local_248[0xe] * -155.54652980329192 * 0.033304469459801506 +
                     local_248[0xd] * 45.771878307987784 * 0.03446136880556896 +
                     local_248[0xc] * -535.7240369423979 * 0.022722624917630486 +
                     local_248[0xb] * -156.82376694627825 * 0.035701535166012134 +
                     local_248[10] * -110.19278746014625 * 0.06233248145608677 +
                     local_248[9] * 185.5005448171647 * 0.06651147322913202 +
                     local_248[8] * 564.188878716436 * 0.07129108148570615 +
                     local_248[7] * 513.9691455669571 * 0.07129108148570615 +
                     local_248[6] * 6.416557417884642 * 0.030297521662727988 +
                     local_248[5] * -333.47333415288796 * 0.055509297807382736 +
                     local_248[4] * 43.06329691642184 * 0.05879931792791203 +
                     local_248[3] * -9.14912592473577 * 0.03125195324707794 +
                     local_248[2] * 325.6182026848913 * 0.06250390649415588 +
                     local_248[1] * 284.54066555558234 * 0.9920634920634921 +
                     local_248[0] * -8.544839292401997 * 0.49603174603174605 + 0.0) *
                     7483016356.337915;
            dVar32 = (local_248[0x14] * 1.31365625 * 0.025031289111389236 +
                     local_248[0x13] * 2.9097766838 * 0.03569643749553795 +
                     local_248[0x12] * 12.813688623999997 * 0.03325573661456601 +
                     local_248[0x11] * 16.765740160799997 * 0.034409194136673316 +
                     local_248[0x10] * 12.890608203799996 * 0.035645540742853074 +
                     local_248[0xf] * 9.607800009999998 * 0.032222723464587225 +
                     local_248[0xe] * 3.651850048199999 * 0.033304469459801506 +
                     local_248[0xd] * 6.1336556343 * 0.03446136880556896 +
                     local_248[0xc] * -6.35716015368 * 0.022722624917630486 +
                     local_248[0xb] * -0.38662657192 * 0.035701535166012134 +
                     local_248[10] * 7.268281403500001 * 0.06233248145608677 +
                     local_248[9] * 11.16710643372 * 0.06651147322913202 +
                     local_248[8] * 17.5522221082 * 0.07129108148570615 +
                     local_248[7] * 16.44011709576 * 0.07129108148570615 +
                     local_248[6] * 5.42075541105 * 0.030297521662727988 +
                     local_248[5] * -2.6797818435599994 * 0.055509297807382736 +
                     local_248[4] * 4.02311877632 * 0.05879931792791203 +
                     local_248[3] * 3.1760433655199996 * 0.03125195324707794 +
                     local_248[2] * 8.828198812712 * 0.06250390649415588 +
                     local_248[1] * 7.868414974743044 * 0.9920634920634921 +
                     local_248[0] * 2.8169492326199994 * 0.49603174603174605 + 0.0) *
                     332578504726.1296;
            if (dVar19 <= dVar23) {
              local_4d8 = local_248[0xe];
              local_4d0 = local_248[0xf];
              local_4c8 = local_248[0x10];
              local_4c0 = local_248[0x13];
              local_4b8 = local_248[0x14];
              if (dVar32 < dVar23) {
                local_648._0_8_ =
                     (dVar32 - dVar23) /
                     ((local_248[0x14] * 1.5 * 0.025031289111389236 +
                      local_248[0x13] * 3.516177664 * 0.03569643749553795 +
                      local_248[0x12] * 19.46618590000001 * 0.03325573661456601 +
                      local_248[0x11] * 16.66175584400002 * 0.034409194136673316 +
                      local_248[0x10] * 14.287224264000004 * 0.035645540742853074 +
                      local_248[0xf] * 11.590704440000001 * 0.032222723464587225 +
                      local_248[0xe] * 8.582954576 * 0.033304469459801506 +
                      local_248[0xd] * 5.897228130399999 * 0.03446136880556896 +
                      local_248[0xc] * 6.4959341236 * 0.022722624917630486 +
                      local_248[0xb] * 3.494093976399998 * 0.035701535166012134 +
                      local_248[10] * 13.115432375 * 0.06233248145608677 +
                      local_248[9] * 8.615688249600005 * 0.06651147322913202 +
                      local_248[8] * 5.774117436000006 * 0.07129108148570615 +
                      local_248[7] * 5.802202710799999 * 0.07129108148570615 +
                      local_248[6] * 6.387270204000001 * 0.030297521662727988 +
                      local_248[5] * 6.2117625892 * 0.055509297807382736 +
                      local_248[4] * 3.6878930491999995 * 0.05879931792791203 +
                      local_248[3] * 3.945561289600001 * 0.03125195324707794 +
                      local_248[2] * 1.5700160029599999 * 0.06250390649415588 +
                      local_248[1] * 1.5000000006507004 * 0.9920634920634921 +
                      local_248[0] * 3.7652661651999977 * 0.49603174603174605 + 0.0) *
                     -83144626.1815324) + 4000.0;
              }
              else {
                if (((double)local_648._0_8_ < 90.0) || (4000.0 < (double)local_648._0_8_)) {
                  local_648._0_8_ = (dVar23 - dVar19) * (3910.0 / (dVar32 - dVar19)) + 90.0;
                }
                local_648._8_8_ = 0;
                iVar8 = 200;
                while( true ) {
                  bVar16 = iVar8 == 0;
                  iVar8 = iVar8 + -1;
                  if (bVar16) break;
                  uStack_3c0 = local_648._8_8_;
                  local_198 = (double)local_648._0_8_ * (double)local_648._0_8_;
                  uVar17 = local_648._8_4_;
                  uVar18 = local_648._12_4_;
                  dVar32 = (double)local_648._0_8_ * local_198;
                  local_3f8._8_4_ = uVar17;
                  local_3f8._0_8_ = dVar32;
                  local_3f8._12_4_ = uVar18;
                  local_3b8 = (double)local_648._0_8_ * dVar32;
                  dVar19 = 1.0 / (double)local_648._0_8_;
                  if (1000.0 <= (double)local_648._0_8_) {
                    local_3c8 = dVar19 * -950.158922 +
                                local_3b8 * 4.00510752e-15 +
                                dVar32 * -4.48915985e-11 +
                                local_198 * 1.66485593e-07 +
                                (double)local_648._0_8_ * -2.47012365e-05 + 2.3372792;
                    local_258 = dVar19 * 25473.6599 +
                                local_3b8 * 9.96394714e-23 +
                                dVar32 * -1.18378809e-18 +
                                local_198 * 5.38539827e-15 +
                                (double)local_648._0_8_ * -1.15421486e-11 + 1.50000001;
                    local_268 = dVar19 * 29217.5791 +
                                local_3b8 * 2.45667382e-16 +
                                dVar32 * -2.50444497e-12 +
                                local_198 * 1.39828196e-08 +
                                (double)local_648._0_8_ * -4.29870569e-05 + 1.56942078;
                    dVar21 = dVar19 * -1088.45772 +
                             local_3b8 * -4.33435588e-15 +
                             dVar32 * 5.23676387e-11 +
                             local_198 * -2.52655556e-07 +
                             (double)local_648._0_8_ * 0.00074154377 + 2.28253784;
                    dVar33 = dVar19 * -30004.2971 +
                             local_3b8 * 3.36401984e-15 +
                             dVar32 * -2.42604967e-11 +
                             local_198 * -5.46908393e-08 +
                             (double)local_648._0_8_ * 0.00108845902 + 2.03399249;
                    dVar34 = dVar19 * 3858.657 +
                             local_3b8 * 2.34824752e-15 +
                             dVar32 * -2.19865389e-11 +
                             local_198 * 4.21684093e-08 +
                             (double)local_648._0_8_ * 0.000274214858 + 2.09288767;
                    dVar30 = dVar19 * 46263.604 +
                             local_3b8 * -3.75455134e-15 +
                             dVar32 * 6.50448872e-11 +
                             local_198 * -4.69648657e-07 +
                             (double)local_648._0_8_ * 0.00182819646 + 1.87410113;
                    dVar31 = dVar19 * 111.856713 +
                             local_3b8 * -2.1581707e-15 +
                             dVar32 * 2.85615925e-11 +
                             local_198 * -2.11219383e-07 +
                             (double)local_648._0_8_ * 0.00111991006 + 3.0172109;
                    dVar35 = dVar19 * 16775.5843 +
                             local_3b8 * -9.34308788e-15 +
                             dVar32 * 1.48921161e-10 +
                             local_198 * -9.95714493e-07 +
                             (double)local_648._0_8_ * 0.00361995018 + 1.28571772;
                    dVar36 = dVar19 * 50925.9997 +
                             local_3b8 * -6.7943273e-15 +
                             dVar32 * 1.044765e-10 +
                             local_198 * -6.70639823e-07 +
                             (double)local_648._0_8_ * 0.00232794318 + 1.29203842;
                    dVar28 = dVar19 * -14151.8724 +
                             local_3b8 * -4.07295432e-15 +
                             dVar32 * 5.7513252e-11 +
                             local_198 * -3.32941924e-07 +
                             (double)local_648._0_8_ * 0.00103126372 + 1.71518561;
                    dVar29 = dVar19 * -9468.34459 +
                             local_3b8 * -2.0363046e-14 +
                             dVar32 * 3.05731338e-10 +
                             local_198 * -1.9109527e-06 +
                             (double)local_648._0_8_ * 0.00669547335 + -0.925148505;
                    dVar26 = dVar19 * 4011.91815 +
                             local_3b8 * -1.06701742e-14 +
                             dVar32 * 1.47290445e-10 +
                             local_198 * -8.28152043e-07 +
                             (double)local_648._0_8_ * 0.00247847763 + 1.77217438;
                    dVar27 = dVar19 * -48759.166 +
                             local_3b8 * -9.44168328e-15 +
                             dVar32 * 1.30872547e-10 +
                             local_198 * -7.38271347e-07 +
                             (double)local_648._0_8_ * 0.00220718513 + 2.85746029;
                    dVar24 = dVar19 * 127.83252 +
                             local_3b8 * -4.225232e-15 +
                             dVar32 * 9.8610775e-11 +
                             local_198 * -8.85461333e-07 +
                             (double)local_648._0_8_ * 0.0039357485 + 2.770799;
                    dVar25 = dVar19 * -13995.8323 +
                             local_3b8 * -1.76771128e-14 +
                             dVar32 * 2.5160303e-10 +
                             local_198 * -1.47419604e-06 +
                             (double)local_648._0_8_ * 0.00460000041 + 0.76069008;
                    dVar20 = dVar19 * 12857.52 +
                             local_3b8 * -2.99283152e-14 +
                             dVar32 * 4.38044223e-10 +
                             local_198 * -2.66068889e-06 +
                             (double)local_648._0_8_ * 0.0086986361 + 0.95465642;
                    dVar22 = dVar19 * 4939.88614 +
                             local_3b8 * -2.51412122e-14 +
                             dVar32 * 3.68057308e-10 +
                             local_198 * -2.23692638e-06 +
                             (double)local_648._0_8_ * 0.00732270755 + 1.03611116;
                    dVar37 = dVar19 * -922.7977 +
                             local_3b8 * -1.3506702e-15 +
                             dVar32 * 2.5242595e-11 +
                             local_198 * -1.89492e-07 +
                             (double)local_648._0_8_ * 0.0007439884 + 1.92664;
                    dVar38 = dVar19 * -11426.3932 +
                             local_3b8 * -3.8000578e-14 +
                             dVar32 * 5.53530003e-10 +
                             local_198 * -3.3418689e-06 +
                             (double)local_648._0_8_ * 0.0108426339 + 0.0718815;
                  }
                  else {
                    local_3c8 = dVar19 * -917.935173 +
                                local_3b8 * -1.47522352e-12 +
                                dVar32 * 5.03930235e-09 +
                                local_198 * -6.492717e-06 +
                                (double)local_648._0_8_ * 0.00399026037 + 1.34433112;
                    local_258 = dVar19 * 25473.6599 +
                                local_3b8 * -1.85546466e-22 +
                                dVar32 * 5.7520408e-19 +
                                local_198 * -6.65306547e-16 +
                                (double)local_648._0_8_ * 3.52666409e-13 + 1.5;
                    local_268 = dVar19 * 29122.2592 +
                                local_3b8 * 4.22531942e-13 +
                                dVar32 * -1.53201656e-09 +
                                local_198 * 2.21435465e-06 +
                                (double)local_648._0_8_ * -0.00163965942 + 2.1682671;
                    dVar21 = dVar19 * -1063.94356 +
                             local_3b8 * 6.48745674e-13 +
                             dVar32 * -2.42032377e-09 +
                             local_198 * 3.282434e-06 +
                             (double)local_648._0_8_ * -0.00149836708 + 2.78245636;
                    dVar33 = dVar19 * -30293.7267 +
                             local_3b8 * 3.54395634e-13 +
                             dVar32 * -1.37199266e-09 +
                             local_198 * 2.17346737e-06 +
                             (double)local_648._0_8_ * -0.00101821705 + 3.19864056;
                    dVar34 = dVar19 * 3615.08056 +
                             local_3b8 * 2.7282294e-13 +
                             dVar32 * -9.70283332e-10 +
                             local_198 * 1.5393128e-06 +
                             (double)local_648._0_8_ * -0.00120065876 + 2.99201543;
                    dVar30 = dVar19 * 46004.0401 +
                             local_3b8 * 3.37483438e-13 +
                             dVar32 * -9.62727883e-10 +
                             local_198 * 9.31632803e-07 +
                             (double)local_648._0_8_ * 0.000484436072 + 2.76267867;
                    dVar31 = dVar19 * 294.80804 +
                             local_3b8 * 1.85845025e-12 +
                             dVar32 * -6.06909735e-09 +
                             local_198 * 7.05276303e-06 +
                             (double)local_648._0_8_ * -0.00237456025 + 3.30179801;
                    dVar35 = dVar19 * 16444.9988 +
                             local_3b8 * 5.08771468e-13 +
                             dVar32 * -1.71779356e-09 +
                             local_198 * 1.91007285e-06 +
                             (double)local_648._0_8_ * 0.00100547588 + 2.6735904;
                    dVar36 = dVar19 * 50496.8163 +
                             local_3b8 * 3.88629474e-13 +
                             dVar32 * -1.67203995e-09 +
                             local_198 * 2.74432073e-06 +
                             (double)local_648._0_8_ * -0.0011833071 + 3.19860411;
                    dVar28 = dVar19 * -14344.086 +
                             local_3b8 * -1.808849e-13 +
                             dVar32 * 2.26751471e-10 +
                             local_198 * 3.3893811e-07 +
                             (double)local_648._0_8_ * -0.00030517684 + 2.57953347;
                    dVar29 = dVar19 * -10246.6476 +
                             local_3b8 * 3.33387912e-12 +
                             dVar32 * -1.21185757e-08 +
                             local_198 * 1.63933533e-05 +
                             (double)local_648._0_8_ * -0.0068354894 + 4.14987613;
                    dVar26 = dVar19 * 3839.56496 +
                             local_3b8 * 8.6753773e-13 +
                             dVar32 * -3.32860233e-09 +
                             local_198 * 4.59331487e-06 +
                             (double)local_648._0_8_ * -0.00162196266 + 3.22118584;
                    dVar27 = dVar19 * -48371.9697 +
                             local_3b8 * -2.87399096e-14 +
                             dVar32 * 6.14797555e-10 +
                             local_198 * -2.3745209e-06 +
                             (double)local_648._0_8_ * 0.00449229839 + 1.35677352;
                    dVar24 = dVar19 * 978.6011 +
                             local_3b8 * 4.15122e-13 +
                             dVar32 * -1.844409e-09 +
                             local_198 * 1.77949067e-06 +
                             (double)local_648._0_8_ * 0.0036082975 + 1.106204;
                    dVar25 = dVar19 * -14308.9567 +
                             local_3b8 * 2.63545304e-12 +
                             dVar32 * -9.48213152e-09 +
                             local_198 * 1.24406669e-05 +
                             (double)local_648._0_8_ * -0.00495416684 + 3.79372315;
                    dVar20 = dVar19 * 12841.6265 +
                             local_3b8 * 4.61018008e-12 +
                             dVar32 * -1.49781651e-08 +
                             local_198 * 1.65714269e-05 +
                             (double)local_648._0_8_ * -0.00209329446 + 3.30646568;
                    dVar22 = dVar19 * 5089.77593 +
                             local_3b8 * 5.39768746e-12 +
                             dVar32 * -1.72897188e-08 +
                             local_198 * 1.90330097e-05 +
                             (double)local_648._0_8_ * -0.00378526124 + 2.95920148;
                    dVar37 = dVar19 * -1020.8999 +
                             local_3b8 * -4.889708e-13 +
                             dVar32 * 1.41037875e-09 +
                             local_198 * -1.321074e-06 +
                             (double)local_648._0_8_ * 0.0007041202 + 2.298677;
                    dVar38 = dVar19 * -11522.2055 +
                             local_3b8 * 5.37371542e-12 +
                             dVar32 * -1.77116571e-08 +
                             local_198 * 1.99812763e-05 +
                             (double)local_648._0_8_ * -0.00275077135 + 3.29142492;
                  }
                  uStack_250 = 0;
                  uStack_260 = 0;
                  dVar39 = local_3b8 * 0.0 +
                           dVar32 * 0.0 + local_198 * 0.0 + (double)local_648._0_8_ * 0.0 + 1.5;
                  dVar19 = (double)local_648._0_8_ * 83144626.1815324 *
                           ((dVar19 * -745.375 + dVar39) * local_248[0x14] * 0.025031289111389236 +
                           local_248[0x13] * dVar37 * 0.03569643749553795 +
                           dVar38 * local_248[0x12] * 0.03325573661456601 +
                           local_248[0x11] * dVar20 * 0.034409194136673316 +
                           dVar22 * local_248[0x10] * 0.035645540742853074 +
                           local_248[0xf] * dVar24 * 0.032222723464587225 +
                           dVar25 * local_248[0xe] * 0.033304469459801506 +
                           local_248[0xd] * dVar26 * 0.03446136880556896 +
                           dVar27 * local_248[0xc] * 0.022722624917630486 +
                           local_248[0xb] * dVar28 * 0.035701535166012134 +
                           dVar29 * local_248[10] * 0.06233248145608677 +
                           local_248[9] * dVar35 * 0.06651147322913202 +
                           dVar36 * local_248[8] * 0.07129108148570615 +
                           local_248[7] * dVar30 * 0.07129108148570615 +
                           dVar31 * local_248[6] * 0.030297521662727988 +
                           local_248[5] * dVar33 * 0.055509297807382736 +
                           dVar34 * local_248[4] * 0.05879931792791203 +
                           dVar21 * local_248[3] * 0.03125195324707794 +
                           local_268 * local_248[2] * 0.06250390649415588 +
                           local_258 * local_248[1] * 0.9920634920634921 +
                           local_3c8 * local_248[0] * 0.49603174603174605 + 0.0);
                  local_3a8._8_4_ = uVar17;
                  local_3a8._0_8_ = dVar19;
                  local_3a8._12_4_ = uVar18;
                  if (1000.0 <= (double)local_648._0_8_) {
                    dVar21 = local_3b8 * -8.8385564e-14 +
                             dVar32 * 1.00641212e-09 +
                             local_198 * -4.42258813e-06 +
                             (double)local_648._0_8_ * 0.00920000082 + 0.76069008;
                    dVar24 = local_3b8 * -2.112616e-14 +
                             dVar32 * 3.944431e-10 +
                             local_198 * -2.656384e-06 +
                             (double)local_648._0_8_ * 0.007871497 + 2.770799;
                    dVar25 = local_3b8 * -4.72084164e-14 +
                             dVar32 * 5.23490188e-10 +
                             local_198 * -2.21481404e-06 +
                             (double)local_648._0_8_ * 0.00441437026 + 2.85746029;
                    dVar26 = local_3b8 * -5.33508711e-14 +
                             dVar32 * 5.89161778e-10 +
                             local_198 * -2.48445613e-06 +
                             (double)local_648._0_8_ * 0.00495695526 + 1.77217438;
                    dVar37 = local_3b8 * -1.0181523e-13 +
                             dVar32 * 1.22292535e-09 +
                             local_198 * -5.73285809e-06 +
                             (double)local_648._0_8_ * 0.0133909467 + -0.925148505;
                    dVar38 = local_3b8 * -2.03647716e-14 +
                             dVar32 * 2.30053008e-10 +
                             local_198 * -9.98825771e-07 +
                             (double)local_648._0_8_ * 0.00206252743 + 1.71518561;
                    dVar40 = local_3b8 * -3.39716365e-14 +
                             dVar32 * 4.17906e-10 +
                             local_198 * -2.01191947e-06 +
                             (double)local_648._0_8_ * 0.00465588637 + 1.29203842;
                    dVar41 = local_3b8 * -4.67154394e-14 +
                             dVar32 * 5.95684644e-10 +
                             local_198 * -2.98714348e-06 +
                             (double)local_648._0_8_ * 0.00723990037 + 1.28571772;
                    dVar27 = local_3b8 * -1.07908535e-14 +
                             dVar32 * 1.1424637e-10 +
                             local_198 * -6.3365815e-07 +
                             (double)local_648._0_8_ * 0.00223982013 + 3.0172109;
                    dVar28 = local_3b8 * -1.87727567e-14 +
                             dVar32 * 2.60179549e-10 +
                             local_198 * -1.40894597e-06 +
                             (double)local_648._0_8_ * 0.00365639292 + 1.87410113;
                    dVar20 = local_3b8 * 1.17412376e-14 +
                             dVar32 * -8.79461556e-11 +
                             local_198 * 1.26505228e-07 +
                             (double)local_648._0_8_ * 0.000548429716 + 2.09288767;
                    dVar22 = local_3b8 * 1.68200992e-14 +
                             dVar32 * -9.7041987e-11 +
                             local_198 * -1.64072518e-07 +
                             (double)local_648._0_8_ * 0.00217691804 + 2.03399249;
                    dVar31 = local_3b8 * 1.22833691e-15 +
                             dVar32 * -1.00177799e-11 +
                             local_198 * 4.19484589e-08 +
                             (double)local_648._0_8_ * -8.59741137e-05 + 1.56942078;
                    dVar33 = local_3b8 * -2.16717794e-14 +
                             dVar32 * 2.09470555e-10 +
                             local_198 * -7.57966669e-07 +
                             (double)local_648._0_8_ * 0.00148308754 + 2.28253784;
                    dVar35 = local_3b8 * 2.00255376e-14 +
                             dVar32 * -1.79566394e-10 +
                             local_198 * 4.99456778e-07 +
                             (double)local_648._0_8_ * -4.94024731e-05 + 2.3372792;
                    dVar36 = local_3b8 * 4.98197357e-22 +
                             dVar32 * -4.73515235e-18 +
                             local_198 * 1.61561948e-14 +
                             (double)local_648._0_8_ * -2.30842973e-11 + 1.50000001;
                    dVar42 = local_3b8 * -1.25706061e-13 +
                             dVar32 * 1.47222923e-09 +
                             local_198 * -6.71077915e-06 +
                             (double)local_648._0_8_ * 0.0146454151 + 1.03611116;
                    dVar29 = local_3b8 * -1.49641576e-13 +
                             dVar32 * 1.75217689e-09 +
                             local_198 * -7.98206668e-06 +
                             (double)local_648._0_8_ * 0.0173972722 + 0.95465642;
                    dVar30 = local_3b8 * -1.9000289e-13 +
                             dVar32 * 2.21412001e-09 +
                             local_198 * -1.00256067e-05 +
                             (double)local_648._0_8_ * 0.0216852677 + 0.0718815;
                    dVar32 = dVar32 * 1.0097038e-10 +
                             local_198 * -5.68476e-07 +
                             (double)local_648._0_8_ * 0.0014879768 + 1.92664;
                    dVar34 = local_3b8 * -6.753351e-15;
                  }
                  else {
                    dVar21 = local_3b8 * 1.31772652e-11 +
                             dVar32 * -3.79285261e-08 +
                             local_198 * 3.73220008e-05 +
                             (double)local_648._0_8_ * -0.00990833369 + 3.79372315;
                    dVar24 = local_3b8 * 2.07561e-12 +
                             dVar32 * -7.377636e-09 +
                             local_198 * 5.338472e-06 +
                             (double)local_648._0_8_ * 0.007216595 + 1.106204;
                    dVar25 = local_3b8 * -1.43699548e-13 +
                             dVar32 * 2.45919022e-09 +
                             local_198 * -7.12356269e-06 +
                             (double)local_648._0_8_ * 0.00898459677 + 1.35677352;
                    dVar26 = local_3b8 * 4.33768865e-12 +
                             dVar32 * -1.33144093e-08 +
                             local_198 * 1.37799446e-05 +
                             (double)local_648._0_8_ * -0.00324392532 + 3.22118584;
                    dVar37 = local_3b8 * 1.66693956e-11 +
                             dVar32 * -4.84743026e-08 +
                             local_198 * 4.91800599e-05 +
                             (double)local_648._0_8_ * -0.0136709788 + 4.14987613;
                    dVar38 = local_3b8 * -9.04424499e-13 +
                             dVar32 * 9.07005884e-10 +
                             local_198 * 1.01681433e-06 +
                             (double)local_648._0_8_ * -0.00061035368 + 2.57953347;
                    dVar40 = local_3b8 * 1.94314737e-12 +
                             dVar32 * -6.68815981e-09 +
                             local_198 * 8.2329622e-06 +
                             (double)local_648._0_8_ * -0.00236661419 + 3.19860411;
                    dVar41 = local_3b8 * 2.54385734e-12 +
                             dVar32 * -6.87117425e-09 +
                             local_198 * 5.73021856e-06 +
                             (double)local_648._0_8_ * 0.00201095175 + 2.6735904;
                    dVar27 = local_3b8 * 9.29225124e-12 +
                             dVar32 * -2.42763894e-08 +
                             local_198 * 2.11582891e-05 +
                             (double)local_648._0_8_ * -0.00474912051 + 3.30179801;
                    dVar28 = local_3b8 * 1.68741719e-12 +
                             dVar32 * -3.85091153e-09 +
                             local_198 * 2.79489841e-06 +
                             (double)local_648._0_8_ * 0.000968872143 + 2.76267867;
                    dVar20 = local_3b8 * 1.3641147e-12 +
                             dVar32 * -3.88113333e-09 +
                             local_198 * 4.61793841e-06 +
                             (double)local_648._0_8_ * -0.00240131752 + 2.99201543;
                    dVar22 = local_3b8 * 1.77197817e-12 +
                             dVar32 * -5.48797062e-09 +
                             local_198 * 6.52040211e-06 +
                             (double)local_648._0_8_ * -0.0020364341 + 3.19864056;
                    dVar31 = local_3b8 * 2.11265971e-12 +
                             dVar32 * -6.12806624e-09 +
                             local_198 * 6.64306396e-06 +
                             (double)local_648._0_8_ * -0.00327931884 + 2.1682671;
                    dVar33 = local_3b8 * 3.24372837e-12 +
                             dVar32 * -9.68129509e-09 +
                             local_198 * 9.84730201e-06 +
                             (double)local_648._0_8_ * -0.00299673416 + 2.78245636;
                    dVar35 = local_3b8 * -7.37611761e-12 +
                             dVar32 * 2.01572094e-08 +
                             local_198 * -1.9478151e-05 +
                             (double)local_648._0_8_ * 0.00798052075 + 1.34433112;
                    dVar36 = local_3b8 * -9.27732332e-22 +
                             dVar32 * 2.30081632e-18 +
                             local_198 * -1.99591964e-15 +
                             (double)local_648._0_8_ * 7.05332819e-13 + 1.5;
                    dVar42 = local_3b8 * 2.69884373e-11 +
                             dVar32 * -6.91588753e-08 +
                             local_198 * 5.70990292e-05 +
                             (double)local_648._0_8_ * -0.00757052247 + 2.95920148;
                    dVar29 = local_3b8 * 2.30509004e-11 +
                             dVar32 * -5.99126606e-08 +
                             local_198 * 4.97142807e-05 +
                             (double)local_648._0_8_ * -0.00418658892 + 3.30646568;
                    dVar30 = local_3b8 * 2.68685771e-11 +
                             dVar32 * -7.08466285e-08 +
                             local_198 * 5.99438288e-05 +
                             (double)local_648._0_8_ * -0.0055015427 + 3.29142492;
                    dVar32 = dVar32 * 5.641515e-09 +
                             local_198 * -3.963222e-06 +
                             (double)local_648._0_8_ * 0.0014082404 + 2.298677;
                    dVar34 = local_3b8 * -2.444854e-12;
                  }
                  dVar32 = (dVar23 - dVar19) /
                           ((dVar39 * local_248[0x14] * 0.025031289111389236 +
                            (dVar34 + dVar32) * local_248[0x13] * 0.03569643749553795 +
                            dVar30 * local_248[0x12] * 0.03325573661456601 +
                            dVar29 * local_248[0x11] * 0.034409194136673316 +
                            dVar42 * local_248[0x10] * 0.035645540742853074 +
                            dVar24 * local_248[0xf] * 0.032222723464587225 +
                            local_248[0xe] * dVar21 * 0.033304469459801506 +
                            dVar26 * local_248[0xd] * 0.03446136880556896 +
                            local_248[0xc] * dVar25 * 0.022722624917630486 +
                            dVar38 * local_248[0xb] * 0.035701535166012134 +
                            local_248[10] * dVar37 * 0.06233248145608677 +
                            dVar41 * local_248[9] * 0.06651147322913202 +
                            local_248[8] * dVar40 * 0.07129108148570615 +
                            dVar28 * local_248[7] * 0.07129108148570615 +
                            local_248[6] * dVar27 * 0.030297521662727988 +
                            dVar22 * local_248[5] * 0.055509297807382736 +
                            local_248[4] * dVar20 * 0.05879931792791203 +
                            dVar33 * local_248[3] * 0.03125195324707794 +
                            local_248[2] * dVar31 * 0.06250390649415588 +
                            dVar36 * local_248[1] * 0.9920634920634921 +
                            local_248[0] * dVar35 * 0.49603174603174605 + 0.0) * 83144626.1815324);
                  dVar19 = 100.0;
                  local_3c8 = dVar39;
                  uStack_3b0 = uStack_3c0;
                  uStack_190 = uStack_3c0;
                  if ((dVar32 <= 100.0) && (dVar19 = -100.0, -100.0 <= dVar32)) {
                    if (ABS(dVar32) < 1e-06) break;
                    dVar19 = dVar32;
                    if (((double)local_648._0_8_ + dVar32 == (double)local_648._0_8_) &&
                       (!NAN((double)local_648._0_8_ + dVar32) && !NAN((double)local_648._0_8_)))
                    break;
                  }
                  local_648._8_4_ = uVar17;
                  local_648._0_8_ = (double)local_648._0_8_ + dVar19;
                  local_648._12_4_ = uVar18;
                }
              }
            }
            else {
              local_648._0_8_ =
                   (dVar19 - dVar23) /
                   ((local_248[0x14] * 1.5 * 0.025031289111389236 +
                    local_248[0x13] * 2.39726879536406 * 0.03569643749553795 +
                    local_248[0x12] * 3.231946745447031 * 0.03325573661456601 +
                    local_248[0x11] * 3.2901943908678444 * 0.034409194136673316 +
                    local_248[0x10] * 2.691710485497553 * 0.035645540742853074 +
                    local_248[0xf] * 1.7936970573281001 * 0.032222723464587225 +
                    local_248[0xe] * 3.1774959892228716 * 0.033304469459801506 +
                    local_248[0xd] * 3.0314285038326267 * 0.03446136880556896 +
                    local_248[0xc] * 2.1094696930540358 * 0.022722624917630486 +
                    local_248[0xb] * 2.533439702871057 * 0.035701535166012134 +
                    local_248[10] * 3.283602435639916 * 0.06233248145608677 +
                    local_248[9] * 2.8961486442878273 * 0.06651147322913202 +
                    local_248[8] * 3.0475476481174555 * 0.07129108148570615 +
                    local_248[7] * 2.8698192369274658 * 0.07129108148570615 +
                    local_248[6] * 3.0286714825412564 * 0.030297521662727988 +
                    local_248[5] * 3.0642922769967536 * 0.055509297807382736 +
                    local_248[4] * 2.810562307688897 * 0.05879931792791203 +
                    local_248[3] * 2.5856685887787454 * 0.03125195324707794 +
                    local_248[2] * 1.922608473790613 * 0.06250390649415588 +
                    local_248[1] * 1.5000000000489295 * 0.9920634920634921 +
                    local_248[0] * 1.9190156229762079 * 0.49603174603174605 + 0.0) *
                   -83144626.1815324) + 90.0;
            }
          }
          else {
            amrex::Abort_host("Wrong reactor type. Choose between 1 (e) or 2 (h).");
          }
          pdVar5[lVar10 + lVar14] = (double)local_648._0_8_;
          local_278[lVar15 - local_298] = 0.0;
          bVar16 = iVar7 != iVar2;
          iVar7 = iVar7 + 1;
        } while (bVar16);
      }
      local_4e8 = (double *)((long)local_4e8 + local_2a8);
      local_4e0 = (double *)((long)local_4e0 + local_3e0);
    }
    local_310 = local_310 + 1;
    local_4f0 = (double *)((long)local_4f0 + local_388);
    local_4f8 = (double *)((long)local_4f8 + local_390);
  } while( true );
}

Assistant:

int
ReactorNull::react(
  const amrex::Box& box,
  amrex::Array4<amrex::Real> const& rY_in,
  amrex::Array4<amrex::Real> const& rYsrc_in,
  amrex::Array4<amrex::Real> const& T_in,
  amrex::Array4<amrex::Real> const& rEner_in,
  amrex::Array4<amrex::Real> const& rEner_src_in,
  amrex::Array4<amrex::Real> const& FC_in,
  amrex::Array4<int> const& /*mask*/,
  amrex::Real& dt_react,
  amrex::Real&
#ifdef MOD_REACTOR
    time
#endif
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t /*stream*/
#endif
)
{
#ifdef MOD_REACTOR
  amrex::Real time_init = time;
#endif

  int captured_reactor_type = m_reactor_type;

  ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    amrex::Real renergy_loc =
      rEner_in(i, j, k, 0) + rEner_src_in(i, j, k, 0) * dt_react;
    rEner_in(i, j, k, 0) = renergy_loc;
    amrex::Real rY_loc[NUM_SPECIES];
    for (int n = 0; n < NUM_SPECIES; n++) {
      rY_loc[n] = rY_in(i, j, k, n) + rYsrc_in(i, j, k, n) * dt_react;
      rY_in(i, j, k, n) = rY_loc[n];
    }
    amrex::Real rho_loc = 0.0;
    for (amrex::Real n : rY_loc) {
      rho_loc += n;
    }
    amrex::Real Y_loc[NUM_SPECIES];
    for (int n = 0; n < NUM_SPECIES; n++) {
      Y_loc[n] = rY_loc[n] / rho_loc;
    }
    amrex::Real energy_loc = renergy_loc / rho_loc;
    amrex::Real T_loc = T_in(i, j, k, 0);
    auto eos = pele::physics::PhysicsType::eos();
    if (captured_reactor_type == ReactorTypes::e_reactor_type) {
      eos.REY2T(rho_loc, energy_loc, Y_loc, T_loc);
    } else if (captured_reactor_type == ReactorTypes::h_reactor_type) {
      eos.RHY2T(rho_loc, energy_loc, Y_loc, T_loc);
    } else {
      amrex::Abort("Wrong reactor type. Choose between 1 (e) or 2 (h).");
    }
    T_in(i, j, k, 0) = T_loc;
    FC_in(i, j, k, 0) = 0.0;
  });

#ifdef MOD_REACTOR
  time = time_init + dt_react;
#endif
  return 0;
}